

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall wallet::WalletInit::Construct(WalletInit *this,NodeContext *node)

{
  ArgsManager *this_00;
  bool bVar1;
  ArgsManager **ppAVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ppAVar2 = inline_assertion_check<true,ArgsManager*&>
                      (&node->args,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
                       ,0x7f,"Construct","node.args");
  this_00 = *ppAVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"-disablewallet",&local_41)
  ;
  bVar1 = ArgsManager::GetBoolArg(this_00,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    logging_function._M_str = "Construct";
    logging_function._M_len = 9;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/init.cpp"
    ;
    source_file._M_len = 0x5f;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x81,ALL,Info,(ConstevalFormatString<0U>)0x6ca3d1);
  }
  else {
    (*node->init->_vptr_Init[5])
              (&local_40,node->init,
               (node->chain)._M_t.
               super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
               _M_t.
               super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
               super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl);
    node->wallet_loader = (WalletLoader *)local_40._M_dataplus._M_p;
    std::
    vector<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>,std::allocator<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>>>
    ::
    emplace_back<std::unique_ptr<interfaces::WalletLoader,std::default_delete<interfaces::WalletLoader>>>
              ((vector<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>,std::allocator<std::unique_ptr<interfaces::ChainClient,std::default_delete<interfaces::ChainClient>>>>
                *)&node->chain_clients,
               (unique_ptr<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                *)&local_40);
    if ((ChainClient *)local_40._M_dataplus._M_p != (ChainClient *)0x0) {
      (*(*(_func_int ***)local_40._M_dataplus._M_p)[1])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletInit::Construct(NodeContext& node) const
{
    ArgsManager& args = *Assert(node.args);
    if (args.GetBoolArg("-disablewallet", DEFAULT_DISABLE_WALLET)) {
        LogPrintf("Wallet disabled!\n");
        return;
    }
    auto wallet_loader = node.init->makeWalletLoader(*node.chain);
    node.wallet_loader = wallet_loader.get();
    node.chain_clients.emplace_back(std::move(wallet_loader));
}